

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void RunScript(BYTE **stream,APlayerPawn *pawn,int snum,int argn,int always)

{
  int iVar1;
  ulong uVar2;
  int arg [4];
  int local_48 [6];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (0 < argn) {
    uVar2 = 0;
    do {
      iVar1 = ReadLong(stream);
      if (uVar2 < 4) {
        local_48[uVar2] = iVar1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argn != uVar2);
  }
  iVar1 = 4;
  if (argn < 4) {
    iVar1 = argn;
  }
  P_StartScript(&pawn->super_AActor,(line_t *)0x0,snum,level.MapName.Chars,local_48,iVar1,always | 8
               );
  return;
}

Assistant:

static void RunScript(BYTE **stream, APlayerPawn *pawn, int snum, int argn, int always)
{
	int arg[4] = { 0, 0, 0, 0 };
	int i;
	
	for (i = 0; i < argn; ++i)
	{
		int argval = ReadLong(stream);
		if ((unsigned)i < countof(arg))
		{
			arg[i] = argval;
		}
	}
	P_StartScript(pawn, NULL, snum, level.MapName, arg, MIN<int>(countof(arg), argn), ACS_NET | always);
}